

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O0

int homoMatrixDerivationTestFromFile(char *homo,char *vel,string *prefix)

{
  double dVar1;
  long lVar2;
  undefined8 uVar3;
  TimeIndex TVar4;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pEVar5;
  ostream *poVar6;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  Index IVar7;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pDVar8;
  Scalar *pSVar9;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar10;
  non_const_type local_900;
  non_const_type local_8f8;
  long local_8f0;
  long j;
  Matrix4 local_868;
  Vector6 local_7e8;
  Matrix<double,__1,__1,_0,__1,__1> local_7b8;
  long local_7a0;
  TimeIndex i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758 [32];
  undefined1 local_738 [8];
  ofstream f2;
  undefined1 local_538 [8];
  ofstream f1;
  ostream local_338 [8];
  ofstream f;
  undefined1 local_138 [8];
  IndexedMatrixArray computedVelocities;
  IndexedMatrixArray homoMatrices;
  undefined1 local_78 [8];
  IndexedMatrixArray velocities;
  string *prefix_local;
  char *vel_local;
  char *homo_local;
  
  velocities.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)prefix;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_78);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_78,vel,6,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&computedVelocities.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&computedVelocities.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,homo,4,4,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_138);
  std::ofstream::ofstream(local_338);
  std::ofstream::ofstream(local_538);
  std::ofstream::ofstream(local_738);
  std::operator+(local_758,
                 (char *)velocities.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::open(local_338,uVar3,0x10);
  std::__cxx11::string::~string((string *)local_758);
  std::operator+(local_778,
                 (char *)velocities.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::open(local_538,uVar3,0x10);
  std::__cxx11::string::~string((string *)local_778);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (char *)velocities.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::open(local_738,uVar3,0x10);
  std::__cxx11::string::~string((string *)&i);
  local_7a0 = stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::getFirstIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&computedVelocities.v_.
                                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
  while( true ) {
    lVar2 = local_7a0;
    TVar4 = stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::getLastIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)&computedVelocities.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (TVar4 <= lVar2) break;
    pEVar5 = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&computedVelocities.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,local_7a0);
    Eigen::Matrix<double,4,4,0,4,4>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,4,4,0,4,4> *)&local_868,pEVar5);
    pEVar5 = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&computedVelocities.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,local_7a0 + 1);
    Eigen::Matrix<double,4,4,0,4,4>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,4,4,0,4,4> *)&j,pEVar5);
    stateObservation::kine::derivateHomogeneousMatrixFD(&local_7e8,&local_868,(Matrix4 *)&j,0.005);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_7b8,
               (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_7e8);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_138,&local_7b8,local_7a0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_7b8);
    poVar6 = (ostream *)std::ostream::operator<<(local_338,local_7a0);
    std::operator<<(poVar6," \t ");
    local_8f0 = 0;
    while( true ) {
      lVar2 = local_8f0;
      this = &stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)local_138,local_7a0)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
      IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(this);
      if (IVar7 <= lVar2) break;
      poVar6 = std::operator<<(local_338," ");
      pDVar8 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_138,local_7a0);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (pDVar8,local_8f0);
      dVar1 = *pSVar9;
      pDVar8 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_78,local_7a0);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (pDVar8,local_8f0);
      std::ostream::operator<<(poVar6,dVar1 - *pSVar9);
      local_8f0 = local_8f0 + 1;
    }
    std::ostream::operator<<(local_338,std::endl<char,std::char_traits<char>>);
    poVar6 = (ostream *)std::ostream::operator<<(local_538,local_7a0);
    poVar6 = std::operator<<(poVar6," \t ");
    pDVar10 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)local_138,local_7a0);
    local_8f8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(pDVar10);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_8f8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = (ostream *)std::ostream::operator<<(local_738,local_7a0);
    poVar6 = std::operator<<(poVar6," \t ");
    pDVar10 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)local_78,local_7a0);
    local_900 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(pDVar10);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_900);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_7a0 = local_7a0 + 1;
  }
  std::ofstream::~ofstream(local_738);
  std::ofstream::~ofstream(local_538);
  std::ofstream::~ofstream(local_338);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_138);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&computedVelocities.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_78);
  return 0;
}

Assistant:

int homoMatrixDerivationTestFromFile(char * homo, char * vel, const std::string & prefix)
{
  IndexedMatrixArray velocities;
  velocities.readFromFile(vel, 6);
  IndexedMatrixArray homoMatrices;
  homoMatrices.readFromFile(homo, 4, 4);

  IndexedMatrixArray computedVelocities;

  std::ofstream f, f1, f2;
  f.open((prefix + "output.dat").c_str());
  f1.open((prefix + "computed.dat").c_str());
  f2.open((prefix + "real.dat").c_str());

  for(TimeIndex i = homoMatrices.getFirstIndex(); i < homoMatrices.getLastIndex(); ++i)
  {
    computedVelocities.setValue(kine::derivateHomogeneousMatrixFD(homoMatrices[i], homoMatrices[i + 1], dt), i);

    f << i << " \t ";
    for(long j = 0; j < computedVelocities[i].rows(); ++j)
    {
      f << " " << computedVelocities[i](j) - velocities[i](j);
    }

    f << std::endl;

    f1 << i << " \t " << computedVelocities[i].transpose() << std::endl;
    f2 << i << " \t " << velocities[i].transpose() << std::endl;
  }

  return 0;
}